

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall
QCalendarPopup::QCalendarPopup
          (QCalendarPopup *this,QWidget *parent,QCalendarWidget *cw,QCalendar ca)

{
  long lVar1;
  QWidgetData *in_RCX;
  QWidget *in_RDX;
  QCalendarPopup *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  WindowType in_stack_ffffffffffffffbc;
  QCalendarPopup *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)in_RSI,in_stack_ffffffffffffffbc);
  QWidget::QWidget(in_RDX,in_RDI,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)this_00 >> 0x20,0));
  *(undefined ***)in_RDI = &PTR_metaObject_00d124d8;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QCalendarPopup_00d12688;
  QPointer<QCalendarWidget>::QPointer((QPointer<QCalendarWidget> *)0x5623ed);
  QDate::QDate((QDate *)in_RSI);
  in_RDI[1].data = in_RCX;
  QWidget::setAttribute(&this->super_QWidget,parent._4_4_,parent._3_1_);
  in_RDI[1].field_0x18 = 0;
  if (in_RDX == (QWidget *)0x0) {
    verifyCalendarInstance(this_00);
  }
  else {
    setCalendarWidget(this,(QCalendarWidget *)parent);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCalendarPopup::QCalendarPopup(QWidget *parent, QCalendarWidget *cw, QCalendar ca)
    : QWidget(parent, Qt::Popup), calendarSystem(ca)
{
    setAttribute(Qt::WA_WindowPropagation);

    dateChanged = false;
    if (!cw) {
        verifyCalendarInstance();
    } else {
        setCalendarWidget(cw);
    }
}